

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsC.cxx
# Opt level: O2

bool __thiscall
cmDependsC::WriteDependencies
          (cmDependsC *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *sources,string *obj,ostream *makeDepends,ostream *internalDepends)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  queue<cmDependsC::UnscannedEntry,_std::deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>_>
  *this_01;
  UnscannedEntry *pUVar1;
  bool bVar2;
  BOM BVar3;
  const_iterator cVar4;
  iterator iVar5;
  iterator iVar6;
  undefined8 *puVar7;
  iterator iVar8;
  mapped_type *pmVar9;
  char *pcVar10;
  ostream *poVar11;
  _Base_ptr p_Var12;
  char *path;
  char *path_00;
  pointer dir_00;
  value_type *__x;
  string fullName;
  ulong local_370;
  string tempPathStr;
  string obj_i;
  _Alloc_hider local_2d8;
  size_type local_2d0;
  string obj_m;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dependencies;
  string dir;
  string binDir;
  _Alloc_hider local_218;
  size_type local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208 [29];
  
  local_370 = (sources->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  if ((local_370 == 0) ||
     ((sources->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent == (_Base_ptr)0x0
     )) {
    pcVar10 = "Cannot scan dependencies without a source file.";
LAB_0044af1c:
    cmSystemTools::Error(pcVar10,(char *)0x0,(char *)0x0,(char *)0x0);
    return false;
  }
  if (obj->_M_string_length == 0) {
    pcVar10 = "Cannot scan dependencies without an object file.";
    goto LAB_0044af1c;
  }
  dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &dependencies._M_t._M_impl.super__Rb_tree_header._M_header;
  dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  dependencies._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (&this->ValidDeps->_M_t !=
      (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
       *)0x0) {
    cVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
            ::find(&this->ValidDeps->_M_t,obj);
    if ((_Rb_tree_header *)cVar4._M_node != &(this->ValidDeps->_M_t)._M_impl.super__Rb_tree_header)
    {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::
      _M_insert_range_unique<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&dependencies,
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  (cVar4._M_node + 2),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 cVar4._M_node[2]._M_parent);
LAB_0044b3d8:
      pcVar10 = cmLocalGenerator::GetBinaryDirectory((this->super_cmDepends).LocalGenerator);
      std::__cxx11::string::string((string *)&binDir,pcVar10,(allocator *)&obj_i);
      cmOutputConverter::ConvertToRelativePath
                (&obj_i,&((this->super_cmDepends).LocalGenerator)->super_cmOutputConverter,&binDir,
                 obj);
      cmSystemTools::ConvertToOutputPath_abi_cxx11_
                (&obj_m,(cmSystemTools *)obj_i._M_dataplus._M_p,path);
      poVar11 = std::operator<<(internalDepends,(string *)&obj_i);
      std::endl<char,std::char_traits<char>>(poVar11);
      for (p_Var12 = dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var12 != &dependencies._M_t._M_impl.super__Rb_tree_header;
          p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12)) {
        poVar11 = std::operator<<(makeDepends,(string *)&obj_m);
        poVar11 = std::operator<<(poVar11,": ");
        cmOutputConverter::ConvertToRelativePath
                  (&fullName,&((this->super_cmDepends).LocalGenerator)->super_cmOutputConverter,
                   &binDir,(string *)(p_Var12 + 1));
        cmSystemTools::ConvertToOutputPath_abi_cxx11_
                  (&tempPathStr,(cmSystemTools *)fullName._M_dataplus._M_p,path_00);
        poVar11 = std::operator<<(poVar11,(string *)&tempPathStr);
        std::endl<char,std::char_traits<char>>(poVar11);
        std::__cxx11::string::~string((string *)&tempPathStr);
        std::__cxx11::string::~string((string *)&fullName);
        poVar11 = std::operator<<(internalDepends," ");
        poVar11 = std::operator<<(poVar11,(string *)(p_Var12 + 1));
        std::endl<char,std::char_traits<char>>(poVar11);
      }
      std::endl<char,std::char_traits<char>>(makeDepends);
      std::__cxx11::string::~string((string *)&obj_m);
      std::__cxx11::string::~string((string *)&obj_i);
      std::__cxx11::string::~string((string *)&binDir);
      bVar2 = true;
      goto LAB_0044b565;
    }
    local_370 = (sources->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  }
  this_00 = &this->Encountered;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this_00->_M_t);
  this_01 = &this->Unscanned;
  for (p_Var12 = (sources->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var12 != &(sources->_M_t)._M_impl.super__Rb_tree_header;
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12)) {
    binDir._M_dataplus._M_p = (pointer)&binDir.field_2;
    binDir._M_string_length = 0;
    binDir.field_2._M_local_buf[0] = '\0';
    local_218._M_p = (pointer)local_208;
    local_210 = 0;
    local_208[0]._M_local_buf[0] = '\0';
    std::__cxx11::string::_M_assign((string *)&binDir);
    std::deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>::push_back
              (&this_01->c,(UnscannedEntry *)&binDir);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)this_00,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var12 + 1));
    UnscannedEntry::~UnscannedEntry((UnscannedEntry *)&binDir);
  }
  obj_m.field_2._8_8_ = &obj_m._M_string_length;
  obj_m._M_string_length._0_4_ = 0;
  obj_m.field_2._M_allocated_capacity = 0;
  tempPathStr._M_dataplus._M_p = (pointer)&tempPathStr.field_2;
  tempPathStr._M_string_length = 0;
  tempPathStr.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)&tempPathStr);
  do {
    pUVar1 = (this->Unscanned).c.
             super__Deque_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((this->Unscanned).c.
        super__Deque_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_cur == pUVar1) {
      std::__cxx11::string::~string((string *)&tempPathStr);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&obj_m);
      goto LAB_0044b3d8;
    }
    UnscannedEntry::UnscannedEntry((UnscannedEntry *)&obj_i,pUVar1);
    std::deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>::pop_front
              (&this_01->c);
    fullName._M_dataplus._M_p = (pointer)&fullName.field_2;
    fullName._M_string_length = 0;
    fullName.field_2._M_local_buf[0] = '\0';
    if ((0 < (int)local_370) ||
       (bVar2 = cmsys::SystemTools::FileIsFullPath(obj_i._M_dataplus._M_p), bVar2)) {
      bVar2 = cmsys::SystemTools::FileExists(obj_i._M_dataplus._M_p,true);
      if (bVar2) goto LAB_0044b103;
    }
    else if ((local_2d0 == 0) ||
            (bVar2 = cmsys::SystemTools::FileExists(local_2d8._M_p,true), !bVar2)) {
      iVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&(this->HeaderLocationCache)._M_t,(key_type *)&obj_i);
      if ((_Rb_tree_header *)iVar8._M_node ==
          &(this->HeaderLocationCache)._M_t._M_impl.super__Rb_tree_header) {
        dir_00 = (this->super_cmDepends).IncludePath.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          if (dir_00 == (this->super_cmDepends).IncludePath.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0044b10d;
          cmSystemTools::CollapseCombinedPath(&binDir,dir_00,&obj_i);
          std::__cxx11::string::operator=((string *)&tempPathStr,(string *)&binDir);
          std::__cxx11::string::~string((string *)&binDir);
          bVar2 = cmsys::SystemTools::FileExists(tempPathStr._M_dataplus._M_p,true);
          dir_00 = dir_00 + 1;
        } while (!bVar2);
        std::__cxx11::string::_M_assign((string *)&fullName);
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this->HeaderLocationCache,(key_type *)&obj_i);
        std::__cxx11::string::_M_assign((string *)pmVar9);
      }
      else {
        std::__cxx11::string::_M_assign((string *)&fullName);
      }
    }
    else {
LAB_0044b103:
      std::__cxx11::string::_M_assign((string *)&fullName);
    }
LAB_0044b10d:
    if (fullName._M_string_length == 0) {
      bVar2 = cmsys::RegularExpression::find(&this->IncludeRegexComplain,obj_i._M_dataplus._M_p);
      if (!bVar2) {
        if (fullName._M_string_length != 0) goto LAB_0044b115;
        goto LAB_0044b134;
      }
      bVar2 = false;
      cmSystemTools::Error("Cannot find file \"",obj_i._M_dataplus._M_p,"\".",(char *)0x0);
    }
    else {
LAB_0044b115:
      iVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&obj_m,&fullName);
      if (iVar5._M_node == (_Base_ptr)&obj_m._M_string_length) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&obj_m,&fullName);
        iVar6 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines_*>_>_>
                ::find(&(this->FileCache)._M_t,&fullName);
        if ((_Rb_tree_header *)iVar6._M_node ==
            &(this->FileCache)._M_t._M_impl.super__Rb_tree_header) {
          std::ifstream::ifstream(&binDir,fullName._M_dataplus._M_p,_S_in);
          if (((*(byte *)((long)&local_218._M_p + *(long *)(binDir._M_dataplus._M_p + -0x18)) & 5)
               == 0) && (BVar3 = cmsys::FStream::ReadBOM((istream *)&binDir), BVar3 < BOM_UTF16BE))
          {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&dependencies,&fullName);
            cmsys::SystemTools::GetFilenamePath(&dir,&fullName);
            Scan(this,(istream *)&binDir,dir._M_dataplus._M_p,&fullName);
            std::__cxx11::string::~string((string *)&dir);
          }
          std::ifstream::~ifstream(&binDir);
        }
        else {
          *(undefined1 *)(*(long *)(iVar6._M_node + 2) + 0x18) = 1;
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&dependencies,&fullName);
          puVar7 = *(undefined8 **)(iVar6._M_node + 2);
          for (__x = (value_type *)*puVar7; __x != (value_type *)puVar7[1]; __x = __x + 1) {
            iVar5 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::find(&this_00->_M_t,&__x->FileName);
            if ((_Rb_tree_header *)iVar5._M_node ==
                &(this->Encountered)._M_t._M_impl.super__Rb_tree_header) {
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)this_00,&__x->FileName);
              std::deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>::
              push_back(&this_01->c,__x);
            }
            puVar7 = *(undefined8 **)(iVar6._M_node + 2);
          }
        }
      }
LAB_0044b134:
      local_370 = (ulong)((int)local_370 - 1);
      bVar2 = true;
    }
    std::__cxx11::string::~string((string *)&fullName);
    UnscannedEntry::~UnscannedEntry((UnscannedEntry *)&obj_i);
  } while (bVar2);
  std::__cxx11::string::~string((string *)&tempPathStr);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&obj_m);
  bVar2 = false;
LAB_0044b565:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&dependencies._M_t);
  return bVar2;
}

Assistant:

bool cmDependsC::WriteDependencies(const std::set<std::string>& sources,
                                   const std::string& obj,
                                   std::ostream& makeDepends,
                                   std::ostream& internalDepends)
{
  // Make sure this is a scanning instance.
  if (sources.empty() || sources.begin()->empty()) {
    cmSystemTools::Error("Cannot scan dependencies without a source file.");
    return false;
  }
  if (obj.empty()) {
    cmSystemTools::Error("Cannot scan dependencies without an object file.");
    return false;
  }

  std::set<std::string> dependencies;
  bool haveDeps = false;

  if (this->ValidDeps != CM_NULLPTR) {
    std::map<std::string, DependencyVector>::const_iterator tmpIt =
      this->ValidDeps->find(obj);
    if (tmpIt != this->ValidDeps->end()) {
      dependencies.insert(tmpIt->second.begin(), tmpIt->second.end());
      haveDeps = true;
    }
  }

  if (!haveDeps) {
    // Walk the dependency graph starting with the source file.
    int srcFiles = (int)sources.size();
    this->Encountered.clear();

    for (std::set<std::string>::const_iterator srcIt = sources.begin();
         srcIt != sources.end(); ++srcIt) {
      UnscannedEntry root;
      root.FileName = *srcIt;
      this->Unscanned.push(root);
      this->Encountered.insert(*srcIt);
    }

    std::set<std::string> scanned;

    // Use reserve to allocate enough memory for tempPathStr
    // so that during the loops no memory is allocated or freed
    std::string tempPathStr;
    tempPathStr.reserve(4 * 1024);

    while (!this->Unscanned.empty()) {
      // Get the next file to scan.
      UnscannedEntry current = this->Unscanned.front();
      this->Unscanned.pop();

      // If not a full path, find the file in the include path.
      std::string fullName;
      if ((srcFiles > 0) ||
          cmSystemTools::FileIsFullPath(current.FileName.c_str())) {
        if (cmSystemTools::FileExists(current.FileName.c_str(), true)) {
          fullName = current.FileName;
        }
      } else if (!current.QuotedLocation.empty() &&
                 cmSystemTools::FileExists(current.QuotedLocation.c_str(),
                                           true)) {
        // The include statement producing this entry was a double-quote
        // include and the included file is present in the directory of
        // the source containing the include statement.
        fullName = current.QuotedLocation;
      } else {
        std::map<std::string, std::string>::iterator headerLocationIt =
          this->HeaderLocationCache.find(current.FileName);
        if (headerLocationIt != this->HeaderLocationCache.end()) {
          fullName = headerLocationIt->second;
        } else {
          for (std::vector<std::string>::const_iterator i =
                 this->IncludePath.begin();
               i != this->IncludePath.end(); ++i) {
            // Construct the name of the file as if it were in the current
            // include directory.  Avoid using a leading "./".

            tempPathStr =
              cmSystemTools::CollapseCombinedPath(*i, current.FileName);

            // Look for the file in this location.
            if (cmSystemTools::FileExists(tempPathStr.c_str(), true)) {
              fullName = tempPathStr;
              HeaderLocationCache[current.FileName] = fullName;
              break;
            }
          }
        }
      }

      // Complain if the file cannot be found and matches the complain
      // regex.
      if (fullName.empty() &&
          this->IncludeRegexComplain.find(current.FileName.c_str())) {
        cmSystemTools::Error("Cannot find file \"", current.FileName.c_str(),
                             "\".");
        return false;
      }

      // Scan the file if it was found and has not been scanned already.
      if (!fullName.empty() && (scanned.find(fullName) == scanned.end())) {
        // Record scanned files.
        scanned.insert(fullName);

        // Check whether this file is already in the cache
        std::map<std::string, cmIncludeLines*>::iterator fileIt =
          this->FileCache.find(fullName);
        if (fileIt != this->FileCache.end()) {
          fileIt->second->Used = true;
          dependencies.insert(fullName);
          for (std::vector<UnscannedEntry>::const_iterator incIt =
                 fileIt->second->UnscannedEntries.begin();
               incIt != fileIt->second->UnscannedEntries.end(); ++incIt) {
            if (this->Encountered.find(incIt->FileName) ==
                this->Encountered.end()) {
              this->Encountered.insert(incIt->FileName);
              this->Unscanned.push(*incIt);
            }
          }
        } else {

          // Try to scan the file.  Just leave it out if we cannot find
          // it.
          cmsys::ifstream fin(fullName.c_str());
          if (fin) {
            cmsys::FStream::BOM bom = cmsys::FStream::ReadBOM(fin);
            if (bom == cmsys::FStream::BOM_None ||
                bom == cmsys::FStream::BOM_UTF8) {
              // Add this file as a dependency.
              dependencies.insert(fullName);

              // Scan this file for new dependencies.  Pass the directory
              // containing the file to handle double-quote includes.
              std::string dir = cmSystemTools::GetFilenamePath(fullName);
              this->Scan(fin, dir.c_str(), fullName);
            } else {
              // Skip file with encoding we do not implement.
            }
          }
        }
      }

      srcFiles--;
    }
  }

  // Write the dependencies to the output stream.  Makefile rules
  // written by the original local generator for this directory
  // convert the dependencies to paths relative to the home output
  // directory.  We must do the same here.
  std::string binDir = this->LocalGenerator->GetBinaryDirectory();
  std::string obj_i = this->LocalGenerator->ConvertToRelativePath(binDir, obj);
  std::string obj_m = cmSystemTools::ConvertToOutputPath(obj_i.c_str());
  internalDepends << obj_i << std::endl;

  for (std::set<std::string>::const_iterator i = dependencies.begin();
       i != dependencies.end(); ++i) {
    makeDepends
      << obj_m << ": "
      << cmSystemTools::ConvertToOutputPath(
           this->LocalGenerator->ConvertToRelativePath(binDir, *i).c_str())
      << std::endl;
    internalDepends << " " << *i << std::endl;
  }
  makeDepends << std::endl;

  return true;
}